

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

UnaryFunctionLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::UnaryFunctionLayerParams>
          (Arena *arena)

{
  UnaryFunctionLayerParams *pUVar1;
  
  if (arena != (Arena *)0x0) {
    pUVar1 = DoCreateMessage<CoreML::Specification::UnaryFunctionLayerParams>(arena);
    return pUVar1;
  }
  pUVar1 = (UnaryFunctionLayerParams *)operator_new(0x28);
  CoreML::Specification::UnaryFunctionLayerParams::UnaryFunctionLayerParams
            (pUVar1,(Arena *)0x0,false);
  return pUVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }